

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

void P_CheckSplash(AActor *self,double distance)

{
  sector_t_conflict *psVar1;
  int iVar2;
  sector_t *floorsec;
  DVector3 pos;
  sector_t_conflict *local_30;
  double local_28;
  DVector3 local_20;
  
  local_20.X = (self->__Pos).X;
  local_20.Y = (self->__Pos).Y;
  local_28 = distance;
  sector_t::LowestFloorAt(self->Sector,(DVector2 *)&local_20,&local_30);
  if (((self->__Pos).Z <= local_28 + self->floorz) &&
     ((sector_t_conflict *)self->floorsector == local_30)) {
    psVar1 = sector_t::GetHeightSec(self->Sector);
    if ((psVar1 == (sector_t_conflict *)0x0) && (local_30->heightsec == (sector_t_conflict *)0x0)) {
      iVar2 = self->Sector->PortalGroup;
      local_20.X = 0.0;
      local_20.Y = 0.0;
      if (iVar2 != local_30->PortalGroup) {
        iVar2 = local_30->PortalGroup * Displacements.size + iVar2;
        local_20.X = Displacements.data.Array[iVar2].pos.X;
        local_20.Y = Displacements.data.Array[iVar2].pos.Y;
      }
      local_20.Y = (self->__Pos).Y + local_20.Y;
      local_20.X = (self->__Pos).X + local_20.X;
      local_20.Z = self->floorz;
      P_HitWater(self,(sector_t *)local_30,&local_20,false,false,false);
    }
  }
  return;
}

Assistant:

void P_CheckSplash(AActor *self, double distance)
{
	sector_t *floorsec;
	self->Sector->LowestFloorAt(self, &floorsec);
	if (self->Z() <= self->floorz + distance && self->floorsector == floorsec && self->Sector->GetHeightSec() == NULL && floorsec->heightsec == NULL)
	{
		// Explosion splashes never alert monsters. This is because A_Explode has
		// a separate parameter for that so this would get in the way of proper 
		// behavior.
		DVector3 pos = self->PosRelative(floorsec);
		pos.Z = self->floorz;
		P_HitWater (self, floorsec, pos, false, false);
	}
}